

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O3

void Diligent::FilterTypeToGLFilterType
               (FILTER_TYPE Filter,GLenum *GLFilter,Bool *bIsAnisotropic,Bool *bIsComparison)

{
  Bool BVar1;
  Bool BVar2;
  GLenum GVar3;
  undefined7 in_register_00000039;
  string msg;
  string local_48;
  
  GVar3 = 0x2600;
  switch(CONCAT71(in_register_00000039,Filter) & 0xffffffff) {
  case 0:
    FormatString<char[24]>(&local_48,(char (*) [24])"Unspecified filter type");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"FilterTypeToGLFilterType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x8b);
    goto LAB_002f84ff;
  case 1:
    break;
  case 2:
    GVar3 = 0x2601;
    break;
  case 3:
    GVar3 = 0x2601;
    BVar1 = true;
    goto LAB_002f851c;
  case 5:
    GVar3 = 0x2601;
  case 4:
    BVar2 = true;
    BVar1 = false;
    goto LAB_002f8534;
  case 6:
    GVar3 = 0x2601;
    BVar1 = true;
    BVar2 = true;
    goto LAB_002f8534;
  default:
    FormatString<char[20]>(&local_48,(char (*) [20])"Unknown filter type");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"FilterTypeToGLFilterType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0xb6);
LAB_002f84ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  BVar1 = false;
LAB_002f851c:
  BVar2 = false;
LAB_002f8534:
  *bIsAnisotropic = BVar1;
  *bIsComparison = BVar2;
  *GLFilter = GVar3;
  return;
}

Assistant:

inline void FilterTypeToGLFilterType(FILTER_TYPE Filter, GLenum& GLFilter, Bool& bIsAnisotropic, Bool& bIsComparison)
{
    switch (Filter)
    {
        case FILTER_TYPE_UNKNOWN:
            UNEXPECTED("Unspecified filter type");
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_POINT:
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_LINEAR:
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_ANISOTROPIC:
            bIsAnisotropic = true;
            bIsComparison  = false;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_COMPARISON_POINT:
            bIsAnisotropic = false;
            bIsComparison  = true;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_COMPARISON_LINEAR:
            bIsAnisotropic = false;
            bIsComparison  = true;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_COMPARISON_ANISOTROPIC:
            bIsAnisotropic = true;
            bIsComparison  = true;
            GLFilter       = GL_LINEAR;
            break;

        default:
            UNEXPECTED("Unknown filter type");
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;
    }
}